

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib586.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  userdata user;
  char *local_40;
  undefined4 local_38;
  
  local_40 = "Pigs in space";
  local_38 = 0;
  curl_mprintf("GLOBAL_INIT\n");
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  curl_mprintf("SHARE_INIT\n");
  lVar2 = curl_share_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_share_init() failed\n");
    goto LAB_00101374;
  }
  curl_mprintf("CURLSHOPT_LOCKFUNC\n");
  iVar1 = curl_share_setopt(lVar2,3,my_lock);
  if (iVar1 == 0) {
    curl_mprintf("CURLSHOPT_UNLOCKFUNC\n");
    iVar1 = curl_share_setopt(lVar2,4,my_unlock);
    if (iVar1 != 0) goto LAB_0010133a;
    curl_mprintf("CURLSHOPT_USERDATA\n");
    iVar1 = curl_share_setopt(lVar2,5,&local_40);
    if (iVar1 != 0) goto LAB_0010133a;
    curl_mprintf("CURL_LOCK_DATA_SSL_SESSION\n");
    iVar4 = 1;
    iVar1 = curl_share_setopt(lVar2,1,4);
    if (iVar1 != 0) goto LAB_0010133a;
    do {
      curl_mprintf("*** run %d\n",iVar4);
      lVar3 = curl_easy_init();
      if (lVar3 == 0) {
        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      }
      else {
        curl_easy_setopt(lVar3,0x40,0);
        curl_easy_setopt(lVar3,0x29,1);
        curl_easy_setopt(lVar3,0x2712,URL);
        curl_mprintf("CURLOPT_SHARE\n");
        curl_easy_setopt(lVar3,0x2774,lVar2);
        curl_mprintf("PERFORM\n");
        iVar1 = curl_easy_perform(lVar3);
        if (iVar1 != 0) {
          curl_mfprintf(_stderr,"perform url \'%s\' repeat %d failed, curlcode %d\n",URL,0,iVar1);
        }
        curl_mprintf("CLEANUP\n");
        curl_easy_cleanup(lVar3);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    curl_mprintf("*** run %d\n",3);
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      if (iVar1 == 0) {
        curl_mprintf("CURLOPT_SHARE\n");
        iVar1 = curl_easy_setopt(lVar3,0x2774,lVar2);
        if (iVar1 == 0) {
          iVar1 = 0;
          curl_mprintf("PERFORM\n");
          curl_easy_perform(lVar3);
          curl_mprintf("try SHARE_CLEANUP...\n");
          iVar4 = curl_share_cleanup(lVar2);
          if (iVar4 == 0) {
            iVar1 = 0;
            curl_mfprintf(_stderr,"curl_share_cleanup succeed but error expected\n");
            lVar2 = 0;
          }
          else {
            curl_mprintf("SHARE_CLEANUP failed, correct\n");
          }
        }
      }
      curl_mprintf("CLEANUP\n");
      curl_easy_cleanup(lVar3);
      curl_mprintf("SHARE_CLEANUP\n");
      iVar4 = curl_share_cleanup(lVar2);
      if (iVar4 != 0) {
        curl_mfprintf(_stderr,"curl_share_cleanup failed, code errno %d\n",iVar4);
      }
      curl_mprintf("GLOBAL_CLEANUP\n");
      curl_global_cleanup();
      return iVar1;
    }
    pcVar5 = "curl_easy_init() failed\n";
  }
  else {
LAB_0010133a:
    pcVar5 = "curl_share_setopt() failed\n";
  }
  curl_mfprintf(_stderr,pcVar5);
  curl_share_cleanup(lVar2);
LAB_00101374:
  curl_global_cleanup();
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  int res;
  CURLSHcode scode = CURLSHE_OK;
  char *url;
  struct Tdata tdata;
  CURL *curl;
  CURLSH *share;
  int i;
  struct userdata user;

  user.text = (char *)"Pigs in space";
  user.counter = 0;

  printf("GLOBAL_INIT\n");
  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* prepare share */
  printf("SHARE_INIT\n");
  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_LOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_UNLOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_USERDATA\n");
    scode = curl_share_setopt(share, CURLSHOPT_USERDATA, &user);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_SSL_SESSION\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE,
                              CURL_LOCK_DATA_SSL_SESSION);
  }

  if(CURLSHE_OK != scode) {
    fprintf(stderr, "curl_share_setopt() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }


  res = 0;

  /* start treads */
  for(i=1; i<=THREADS; i++) {

    /* set thread data */
    tdata.url   = URL;
    tdata.share = share;

    /* simulate thread, direct call of "thread" function */
    printf("*** run %d\n",i);
    fire(&tdata);
  }


  /* fetch a another one */
  printf("*** run %d\n", i);
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  url = URL;
  test_setopt(curl, CURLOPT_URL, url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE, share);

  printf("PERFORM\n");
  curl_easy_perform(curl);

  /* try to free share, expect to fail because share is in use*/
  printf("try SHARE_CLEANUP...\n");
  scode = curl_share_cleanup(share);
  if(scode==CURLSHE_OK) {
    fprintf(stderr, "curl_share_cleanup succeed but error expected\n");
    share = NULL;
  }
  else {
    printf("SHARE_CLEANUP failed, correct\n");
  }

test_cleanup:

  /* clean up last handle */
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);

  /* free share */
  printf("SHARE_CLEANUP\n");
  scode = curl_share_cleanup(share);
  if(scode!=CURLSHE_OK)
    fprintf(stderr, "curl_share_cleanup failed, code errno %d\n",
            (int)scode);

  printf("GLOBAL_CLEANUP\n");
  curl_global_cleanup();

  return res;
}